

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_NtkObjMffcEstimate(Acb_Ntk_t *pNtk,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_38;
  int local_34;
  int iFaninCrit;
  int Count;
  int *pFanins;
  int local_20;
  int iFanin;
  int k;
  int iObj_local;
  Acb_Ntk_t *pNtk_local;
  
  local_34 = 0;
  local_38 = -1;
  local_20 = 0;
  piVar3 = Acb_ObjFanins(pNtk,iObj);
  for (; local_20 < *piVar3; local_20 = local_20 + 1) {
    iVar2 = piVar3[local_20 + 1];
    iVar1 = Acb_ObjIsAreaCritical(pNtk,iVar2);
    if (iVar1 != 0) {
      local_34 = local_34 + 1;
      local_38 = iVar2;
    }
  }
  if (local_34 == 1) {
    local_20 = 0;
    piVar3 = Acb_ObjFanins(pNtk,local_38);
    for (; local_20 < *piVar3; local_20 = local_20 + 1) {
      iVar2 = Acb_ObjIsAreaCritical(pNtk,piVar3[local_20 + 1]);
      if (iVar2 != 0) {
        local_34 = local_34 + 1;
      }
    }
    pNtk_local._4_4_ = local_34;
  }
  else {
    pNtk_local._4_4_ = local_34;
  }
  return pNtk_local._4_4_;
}

Assistant:

static inline int Acb_NtkObjMffcEstimate( Acb_Ntk_t * pNtk, int iObj )
{
    int k, iFanin, * pFanins, Count = 0, iFaninCrit = -1;
    Acb_ObjForEachFaninFast( pNtk, iObj, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            iFaninCrit = iFanin, Count++;
    if ( Count != 1 )
        return Count;
    Acb_ObjForEachFaninFast( pNtk, iFaninCrit, pFanins, iFanin, k )
        if ( Acb_ObjIsAreaCritical(pNtk, iFanin) )
            Count++;
    return Count;
}